

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

bool IsCode(string *ext)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_);
    if (iVar1 != 0) {
      local_160[0] = local_150;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_160,".c","");
      local_140[0] = local_130;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,".C","");
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,".cc","");
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,".cpp","");
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,".m","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,".mm","");
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,".h","");
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,".H","");
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,".hpp","");
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,".hh","");
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_,local_160,
                 &stack0xffffffffffffffe0,0,&local_161,&local_162,&local_163);
      lVar3 = 0;
      do {
        if (local_30 + lVar3 != *(undefined1 **)((long)local_40 + lVar3)) {
          operator_delete(*(undefined1 **)((long)local_40 + lVar3));
        }
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x140);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_._M_h,ext);
  return cVar2.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

static bool IsCode(const std::string &ext) {
    static const std::unordered_set<std::string> exts = { ".c", ".C", ".cc", ".cpp", ".m", ".mm", ".h", ".H", ".hpp", ".hh" };
    return exts.count(ext) > 0;
}